

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::hash_subpass_base<VkSubpassDescription>
               (Hasher *h,VkSubpassDescription *subpass)

{
  bool bVar1;
  uint local_30;
  uint local_2c;
  uint32_t i_3;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  VkSubpassDescription *subpass_local;
  Hasher *h_local;
  
  Hasher::u32(h,subpass->flags);
  Hasher::u32(h,subpass->colorAttachmentCount);
  Hasher::u32(h,subpass->inputAttachmentCount);
  Hasher::u32(h,subpass->preserveAttachmentCount);
  Hasher::u32(h,subpass->pipelineBindPoint);
  for (i_2 = 0; i_2 < subpass->preserveAttachmentCount; i_2 = i_2 + 1) {
    Hasher::u32(h,subpass->pPreserveAttachments[i_2]);
  }
  for (i_3 = 0; i_3 < subpass->colorAttachmentCount; i_3 = i_3 + 1) {
    bVar1 = hash_reference_base(h,subpass->pColorAttachments + i_3);
    if (!bVar1) {
      return false;
    }
  }
  for (local_2c = 0; local_2c < subpass->inputAttachmentCount; local_2c = local_2c + 1) {
    bVar1 = hash_reference_base(h,subpass->pInputAttachments + local_2c);
    if (!bVar1) {
      return false;
    }
  }
  if (subpass->pResolveAttachments != (VkAttachmentReference *)0x0) {
    for (local_30 = 0; local_30 < subpass->colorAttachmentCount; local_30 = local_30 + 1) {
      bVar1 = hash_reference_base(h,subpass->pResolveAttachments + local_30);
      if (!bVar1) {
        return false;
      }
    }
  }
  if (subpass->pDepthStencilAttachment == (VkAttachmentReference *)0x0) {
    Hasher::u32(h,0);
  }
  else {
    bVar1 = hash_reference_base(h,subpass->pDepthStencilAttachment);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool hash_subpass_base(Hasher &h, const Subpass &subpass)
{
	h.u32(subpass.flags);
	h.u32(subpass.colorAttachmentCount);
	h.u32(subpass.inputAttachmentCount);
	h.u32(subpass.preserveAttachmentCount);
	h.u32(subpass.pipelineBindPoint);

	for (uint32_t i = 0; i < subpass.preserveAttachmentCount; i++)
		h.u32(subpass.pPreserveAttachments[i]);

	for (uint32_t i = 0; i < subpass.colorAttachmentCount; i++)
		if (!hash_reference_base(h, subpass.pColorAttachments[i]))
			return false;
	for (uint32_t i = 0; i < subpass.inputAttachmentCount; i++)
		if (!hash_reference_base(h, subpass.pInputAttachments[i]))
			return false;

	if (subpass.pResolveAttachments)
		for (uint32_t i = 0; i < subpass.colorAttachmentCount; i++)
			if (!hash_reference_base(h, subpass.pResolveAttachments[i]))
				return false;

	if (subpass.pDepthStencilAttachment)
	{
		if (!hash_reference_base(h, *subpass.pDepthStencilAttachment))
			return false;
	}
	else
		h.u32(0);

	return true;
}